

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx::
     BVHNIntersectorKHybrid<4,_4,_16777232,_false,_embree::avx::ArrayIntersectorK_1<4,_embree::avx::QuadMiMBIntersectorKMoeller<4,_4,_true>_>,_true>
     ::occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  RayK<4> *pRVar1;
  BVH *bvh;
  size_t sVar2;
  Geometry *pGVar3;
  long lVar4;
  RTCFilterFunctionN p_Var5;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  vbool<4> vVar20;
  uint uVar21;
  undefined4 uVar22;
  int iVar23;
  AABBNodeMB4D *node1;
  ulong uVar24;
  ulong uVar25;
  long lVar26;
  ulong uVar27;
  ulong uVar28;
  QuadMesh *mesh;
  NodeRef root;
  long lVar29;
  ulong uVar30;
  uint uVar31;
  ulong uVar32;
  ulong uVar33;
  ulong uVar34;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar35;
  NodeRef *pNVar36;
  bool bVar37;
  float fVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  float fVar55;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  float fVar53;
  float fVar54;
  undefined1 in_ZMM0 [64];
  float fVar78;
  float fVar79;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  float fVar80;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [64];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  float fVar91;
  undefined1 auVar90 [64];
  vint4 ai_2;
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  anon_union_16_2_9473010e_for_vint_impl<4>_1 aVar98;
  float fVar99;
  float fVar109;
  float fVar110;
  vint4 bi_1;
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  float fVar111;
  undefined1 auVar108 [16];
  float fVar112;
  float fVar113;
  float fVar114;
  float fVar115;
  float fVar127;
  float fVar131;
  vint4 bi_3;
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  float fVar128;
  float fVar129;
  float fVar130;
  float fVar132;
  float fVar133;
  float fVar134;
  float fVar135;
  float fVar136;
  float fVar137;
  float fVar138;
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  float fVar139;
  float fVar146;
  float fVar147;
  vint4 bi;
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  float fVar148;
  undefined1 auVar145 [16];
  float fVar149;
  float fVar156;
  float fVar157;
  vint4 bi_2;
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  float fVar158;
  undefined1 auVar155 [16];
  float fVar159;
  float fVar162;
  float fVar163;
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  float fVar164;
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar169 [16];
  undefined1 in_ZMM10 [64];
  undefined1 auVar170 [48];
  uint uVar171;
  float fVar172;
  uint uVar174;
  float fVar175;
  uint uVar176;
  float fVar177;
  uint uVar178;
  float fVar179;
  undefined1 auVar173 [16];
  float fVar180;
  float fVar182;
  float fVar183;
  undefined1 auVar181 [16];
  float fVar184;
  float fVar185;
  float fVar190;
  uint uVar191;
  float fVar192;
  vint4 ai;
  undefined1 auVar186 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar187;
  uint uVar193;
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  float fVar194;
  vint4 ai_1;
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 in_ZMM14 [64];
  vint4 ai_3;
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  vuint<4> *v;
  undefined1 local_1a18 [8];
  float fStack_1a10;
  float fStack_1a0c;
  Precalculations pre;
  vint<4> itime;
  Vec3<embree::vfloat_impl<4>_> p1;
  undefined1 local_1998 [8];
  float fStack_1990;
  float fStack_198c;
  undefined1 local_1988 [8];
  undefined8 uStack_1980;
  vbool<4> terminated;
  Vec3<embree::vfloat_impl<4>_> p0;
  float local_18a8;
  float fStack_18a4;
  float fStack_18a0;
  float fStack_189c;
  float local_1898;
  float fStack_1894;
  float fStack_1890;
  float fStack_188c;
  undefined8 local_1868;
  undefined8 uStack_1860;
  TravRayK<4,_false> tray;
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  undefined1 auVar168 [64];
  
  uVar19 = mm_lookupmask_ps._248_8_;
  uVar18 = mm_lookupmask_ps._240_8_;
  uVar17 = mm_lookupmask_ps._8_8_;
  uVar16 = mm_lookupmask_ps._0_8_;
  bvh = (BVH *)This->ptr;
  stack_node[1].ptr = (bvh->root).ptr;
  if (stack_node[1].ptr != 8) {
    auVar52 = vpcmpeqd_avx(in_ZMM0._0_16_,in_ZMM0._0_16_);
    auVar81 = vpcmpeqd_avx(auVar52,(undefined1  [16])valid_i->field_0);
    auVar56 = ZEXT816(0) << 0x40;
    auVar7 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar56,5);
    auVar43 = auVar81 & auVar7;
    if ((((auVar43 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
         (auVar43 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar43 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar43[0xf] < '\0')
    {
      auVar7 = vandps_avx(auVar7,auVar81);
      tray.org.field_0._0_8_ = *(undefined8 *)ray;
      tray.org.field_0._8_8_ = *(undefined8 *)(ray + 8);
      tray.org.field_0._16_8_ = *(undefined8 *)(ray + 0x10);
      tray.org.field_0._24_8_ = *(undefined8 *)(ray + 0x18);
      tray.org.field_0._32_8_ = *(undefined8 *)(ray + 0x20);
      tray.org.field_0._40_8_ = *(undefined8 *)(ray + 0x28);
      tray.dir.field_0.field_0.x.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x40);
      tray.dir.field_0.field_0.y.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x50);
      tray.dir.field_0.field_0.z.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x60);
      auVar165._8_4_ = 0x7fffffff;
      auVar165._0_8_ = 0x7fffffff7fffffff;
      auVar165._12_4_ = 0x7fffffff;
      auVar168 = ZEXT1664(auVar165);
      auVar81 = vandps_avx(auVar165,(undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar150._8_4_ = 0x219392ef;
      auVar150._0_8_ = 0x219392ef219392ef;
      auVar150._12_4_ = 0x219392ef;
      auVar81 = vcmpps_avx(auVar81,auVar150,1);
      auVar43 = vblendvps_avx((undefined1  [16])tray.dir.field_0.field_0.x.field_0,auVar150,auVar81)
      ;
      auVar81 = vandps_avx(auVar165,(undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar81 = vcmpps_avx(auVar81,auVar150,1);
      auVar101 = vblendvps_avx((undefined1  [16])tray.dir.field_0.field_0.y.field_0,auVar150,auVar81
                              );
      auVar81 = vandps_avx(auVar165,(undefined1  [16])tray.dir.field_0.field_0.z.field_0);
      auVar81 = vcmpps_avx(auVar81,auVar150,1);
      auVar81 = vblendvps_avx((undefined1  [16])tray.dir.field_0.field_0.z.field_0,auVar150,auVar81)
      ;
      auVar100 = vrcpps_avx(auVar43);
      fVar53 = auVar100._0_4_;
      auVar92._0_4_ = auVar43._0_4_ * fVar53;
      fVar54 = auVar100._4_4_;
      auVar92._4_4_ = auVar43._4_4_ * fVar54;
      fVar55 = auVar100._8_4_;
      auVar92._8_4_ = auVar43._8_4_ * fVar55;
      fVar91 = auVar100._12_4_;
      auVar92._12_4_ = auVar43._12_4_ * fVar91;
      auVar151._8_4_ = 0x3f800000;
      auVar151._0_8_ = 0x3f8000003f800000;
      auVar151._12_4_ = 0x3f800000;
      auVar43 = vsubps_avx(auVar151,auVar92);
      tray.rdir.field_0._0_4_ = fVar53 + fVar53 * auVar43._0_4_;
      tray.rdir.field_0._4_4_ = fVar54 + fVar54 * auVar43._4_4_;
      tray.rdir.field_0._8_4_ = fVar55 + fVar55 * auVar43._8_4_;
      tray.rdir.field_0._12_4_ = fVar91 + fVar91 * auVar43._12_4_;
      auVar43 = vrcpps_avx(auVar101);
      fVar53 = auVar43._0_4_;
      auVar100._0_4_ = auVar101._0_4_ * fVar53;
      fVar54 = auVar43._4_4_;
      auVar100._4_4_ = auVar101._4_4_ * fVar54;
      fVar55 = auVar43._8_4_;
      auVar100._8_4_ = auVar101._8_4_ * fVar55;
      fVar91 = auVar43._12_4_;
      auVar100._12_4_ = auVar101._12_4_ * fVar91;
      auVar43 = vsubps_avx(auVar151,auVar100);
      tray.rdir.field_0._16_4_ = fVar53 + fVar53 * auVar43._0_4_;
      tray.rdir.field_0._20_4_ = fVar54 + fVar54 * auVar43._4_4_;
      tray.rdir.field_0._24_4_ = fVar55 + fVar55 * auVar43._8_4_;
      tray.rdir.field_0._28_4_ = fVar91 + fVar91 * auVar43._12_4_;
      auVar43 = vrcpps_avx(auVar81);
      fVar53 = auVar43._0_4_;
      auVar116._0_4_ = auVar81._0_4_ * fVar53;
      fVar54 = auVar43._4_4_;
      auVar116._4_4_ = auVar81._4_4_ * fVar54;
      fVar55 = auVar43._8_4_;
      auVar116._8_4_ = auVar81._8_4_ * fVar55;
      fVar91 = auVar43._12_4_;
      auVar116._12_4_ = auVar81._12_4_ * fVar91;
      auVar81 = vsubps_avx(auVar151,auVar116);
      tray.rdir.field_0._32_4_ = fVar53 + fVar53 * auVar81._0_4_;
      tray.rdir.field_0._36_4_ = fVar54 + fVar54 * auVar81._4_4_;
      tray.rdir.field_0._40_4_ = fVar55 + fVar55 * auVar81._8_4_;
      tray.rdir.field_0._44_4_ = fVar91 + fVar91 * auVar81._12_4_;
      auVar81 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.x.field_0,auVar56,1);
      auVar140._8_4_ = 0x10;
      auVar140._0_8_ = 0x1000000010;
      auVar140._12_4_ = 0x10;
      tray.nearXYZ.field_0.field_0.x.field_0 = (vint_impl<4>)vandps_avx(auVar81,auVar140);
      auVar81 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.y.field_0,auVar56,5);
      auVar43._8_4_ = 0x20;
      auVar43._0_8_ = 0x2000000020;
      auVar43._12_4_ = 0x20;
      auVar141._8_4_ = 0x30;
      auVar141._0_8_ = 0x3000000030;
      auVar141._12_4_ = 0x30;
      tray.nearXYZ.field_0.field_0.y.field_0 = (vint_impl<4>)vblendvps_avx(auVar141,auVar43,auVar81)
      ;
      auVar81 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.z.field_0,auVar56,5);
      auVar101._8_4_ = 0x40;
      auVar101._0_8_ = 0x4000000040;
      auVar101._12_4_ = 0x40;
      auVar117._8_4_ = 0x50;
      auVar117._0_8_ = 0x5000000050;
      auVar117._12_4_ = 0x50;
      tray.nearXYZ.field_0.field_0.z.field_0 =
           (vint_impl<4>)vblendvps_avx(auVar117,auVar101,auVar81);
      auVar81 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar56);
      auVar43 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar56);
      auVar56._8_4_ = 0x7f800000;
      auVar56._0_8_ = 0x7f8000007f800000;
      auVar56._12_4_ = 0x7f800000;
      tray.tnear.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vblendvps_avx(auVar56,auVar81,auVar7);
      auVar81._8_4_ = 0xff800000;
      auVar81._0_8_ = 0xff800000ff800000;
      auVar81._12_4_ = 0xff800000;
      tray.tfar.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vblendvps_avx(auVar81,auVar43,auVar7);
      terminated.field_0.i[1] = auVar7._4_4_ ^ auVar52._4_4_;
      terminated.field_0.i[0] = auVar7._0_4_ ^ auVar52._0_4_;
      terminated.field_0.i[2] = auVar7._8_4_ ^ auVar52._8_4_;
      terminated.field_0.i[3] = auVar7._12_4_ ^ auVar52._12_4_;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar31 = 3;
      }
      else {
        uVar31 = ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                 RTC_RAY_QUERY_FLAG_INCOHERENT) + 2;
      }
      pRVar1 = ray + 0x80;
      pNVar36 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      paVar35 = &stack_near[2].field_0;
      stack_near[0].field_0.i[0] = 0x7f800000;
      stack_near[0].field_0.i[1] = 0x7f800000;
      stack_near[0].field_0.i[2] = 0x7f800000;
      stack_near[0].field_0.i[3] = 0x7f800000;
      stack_near[1].field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)tray.tnear;
      auVar52 = vpcmpeqd_avx((undefined1  [16])tray.tnear.field_0,
                             (undefined1  [16])tray.tnear.field_0);
      auVar77 = ZEXT1664(auVar52);
LAB_002fe4ff:
      do {
        do {
          root.ptr = pNVar36[-1].ptr;
          if (root.ptr == 0xfffffffffffffff8) goto LAB_002ff9d2;
          pNVar36 = pNVar36 + -1;
          paVar35 = paVar35 + -1;
          aVar187 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar35->v;
          auVar52 = vcmpps_avx((undefined1  [16])aVar187,(undefined1  [16])tray.tfar.field_0,1);
          uVar21 = vmovmskps_avx(auVar52);
        } while (uVar21 == 0);
        uVar24 = (ulong)(uVar21 & 0xff);
        uVar21 = POPCOUNT(uVar21 & 0xff);
        if (uVar31 < uVar21) {
LAB_002fe53d:
          vVar20.field_0 = terminated.field_0;
          auVar90 = ZEXT1664((undefined1  [16])aVar187);
          do {
            auVar52 = auVar77._0_16_;
            uVar21 = (uint)root.ptr;
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_002ff9d2;
              auVar81 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,auVar90._0_16_,6);
              if ((((auVar81 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar81 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar81 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar81[0xf] < '\0') {
                uVar24 = (ulong)(uVar21 & 0xf);
                if (uVar24 != 8) {
                  uVar25 = 0;
                  auVar81 = (undefined1  [16])terminated.field_0 ^ auVar52;
                  do {
                    lVar26 = uVar25 * 0x60 + (root.ptr & 0xfffffffffffffff0);
                    uVar21 = vmovmskps_avx(auVar81);
                    uVar32 = (ulong)uVar21;
                    auVar90 = ZEXT1664(auVar81);
                    uVar28 = 0;
                    while( true ) {
                      auVar196 = in_ZMM14._0_16_;
                      auVar43 = auVar90._0_16_;
                      auVar166 = auVar168._0_16_;
                      uVar171 = *(uint *)(lVar26 + 0x50 + uVar28 * 4);
                      if (uVar171 == 0xffffffff) break;
                      uVar174 = *(uint *)(lVar26 + 0x40 + uVar28 * 4);
                      pGVar3 = (context->scene->geometries).items[uVar174].ptr;
                      fVar53 = (pGVar3->time_range).lower;
                      auVar39._4_4_ = fVar53;
                      auVar39._0_4_ = fVar53;
                      auVar39._8_4_ = fVar53;
                      auVar39._12_4_ = fVar53;
                      fVar54 = pGVar3->fnumTimeSegments;
                      auVar8 = vsubps_avx(*(undefined1 (*) [16])(ray + 0x70),auVar39);
                      auVar52 = ZEXT416((uint)((pGVar3->time_range).upper - fVar53));
                      auVar52 = vshufps_avx(auVar52,auVar52,0);
                      auVar52 = vdivps_avx(auVar8,auVar52);
                      auVar40._0_4_ = fVar54 * auVar52._0_4_;
                      auVar40._4_4_ = fVar54 * auVar52._4_4_;
                      auVar40._8_4_ = fVar54 * auVar52._8_4_;
                      auVar40._12_4_ = fVar54 * auVar52._12_4_;
                      auVar52 = vroundps_avx(auVar40,1);
                      auVar56 = vshufps_avx(ZEXT416((uint)(fVar54 + -1.0)),
                                            ZEXT416((uint)(fVar54 + -1.0)),0);
                      auVar52 = vminps_avx(auVar52,auVar56);
                      auVar52 = vmaxps_avx(auVar52,_DAT_01f7aa10);
                      auVar56 = vsubps_avx(auVar40,auVar52);
                      itime.field_0 =
                           (anon_union_16_2_9473010e_for_vint_impl<4>_1)vcvtps2dq_avx(auVar52);
                      uVar27 = 0;
                      if (uVar32 != 0) {
                        for (; (uVar21 >> uVar27 & 1) == 0; uVar27 = uVar27 + 1) {
                        }
                      }
                      auVar101 = vpshufd_avx(ZEXT416((uint)itime.field_0.i[uVar27]),0);
                      auVar52 = vpcmpeqd_avx(auVar101,(undefined1  [16])itime.field_0);
                      auVar52 = auVar81 & ~auVar52;
                      fVar54 = auVar56._4_4_;
                      fVar55 = auVar56._8_4_;
                      fVar91 = auVar56._12_4_;
                      fVar53 = auVar56._0_4_;
                      if ((((auVar52 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                           (auVar52 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar52 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          -1 < auVar52[0xf]) {
                        lVar29 = (long)itime.field_0.i[uVar27] * 0x38;
                        lVar4 = *(long *)(*(long *)&pGVar3[2].numPrimitives + lVar29);
                        lVar29 = *(long *)(*(long *)&pGVar3[2].numPrimitives + 0x38 + lVar29);
                        uVar27 = (ulong)*(uint *)(lVar26 + uVar28 * 4);
                        uVar34 = (ulong)*(uint *)(lVar26 + 0x10 + uVar28 * 4);
                        fVar38 = *(float *)(lVar4 + uVar27 * 4);
                        fVar78 = *(float *)(lVar4 + 4 + uVar27 * 4);
                        fVar79 = *(float *)(lVar4 + 8 + uVar27 * 4);
                        fVar80 = *(float *)(lVar29 + uVar27 * 4);
                        fVar99 = *(float *)(lVar29 + 4 + uVar27 * 4);
                        fVar109 = *(float *)(lVar29 + 8 + uVar27 * 4);
                        auVar58._8_4_ = 0x3f800000;
                        auVar58._0_8_ = 0x3f8000003f800000;
                        auVar58._12_4_ = 0x3f800000;
                        auVar52 = vsubps_avx(auVar58,auVar56);
                        fVar110 = auVar52._0_4_;
                        fVar111 = auVar52._4_4_;
                        fVar172 = auVar52._8_4_;
                        fVar175 = auVar52._12_4_;
                        auVar203._0_4_ = fVar110 * fVar38 + fVar53 * fVar80;
                        auVar203._4_4_ = fVar111 * fVar38 + fVar54 * fVar80;
                        auVar203._8_4_ = fVar172 * fVar38 + fVar55 * fVar80;
                        auVar203._12_4_ = fVar175 * fVar38 + fVar91 * fVar80;
                        auVar94._0_4_ = fVar110 * fVar78 + fVar53 * fVar99;
                        auVar94._4_4_ = fVar111 * fVar78 + fVar54 * fVar99;
                        auVar94._8_4_ = fVar172 * fVar78 + fVar55 * fVar99;
                        auVar94._12_4_ = fVar175 * fVar78 + fVar91 * fVar99;
                        auVar105._0_4_ = fVar110 * fVar79 + fVar53 * fVar109;
                        auVar105._4_4_ = fVar111 * fVar79 + fVar54 * fVar109;
                        auVar105._8_4_ = fVar172 * fVar79 + fVar55 * fVar109;
                        auVar105._12_4_ = fVar175 * fVar79 + fVar91 * fVar109;
                        fVar38 = *(float *)(lVar4 + uVar34 * 4);
                        fVar78 = *(float *)(lVar4 + 4 + uVar34 * 4);
                        fVar79 = *(float *)(lVar4 + 8 + uVar34 * 4);
                        fVar80 = *(float *)(lVar29 + uVar34 * 4);
                        fVar99 = *(float *)(lVar29 + 4 + uVar34 * 4);
                        fVar109 = *(float *)(lVar29 + 8 + uVar34 * 4);
                        auVar82._0_4_ = fVar80 * fVar53 + fVar110 * fVar38;
                        auVar82._4_4_ = fVar80 * fVar54 + fVar111 * fVar38;
                        auVar82._8_4_ = fVar80 * fVar55 + fVar172 * fVar38;
                        auVar82._12_4_ = fVar80 * fVar91 + fVar175 * fVar38;
                        auVar197._0_4_ = fVar99 * fVar53 + fVar110 * fVar78;
                        auVar197._4_4_ = fVar99 * fVar54 + fVar111 * fVar78;
                        auVar197._8_4_ = fVar99 * fVar55 + fVar172 * fVar78;
                        auVar197._12_4_ = fVar99 * fVar91 + fVar175 * fVar78;
                        aVar187._0_4_ = fVar109 * fVar53 + fVar110 * fVar79;
                        aVar187._4_4_ = fVar109 * fVar54 + fVar111 * fVar79;
                        aVar187._8_4_ = fVar109 * fVar55 + fVar172 * fVar79;
                        aVar187._12_4_ = fVar109 * fVar91 + fVar175 * fVar79;
                        uVar27 = (ulong)*(uint *)(lVar26 + 0x20 + uVar28 * 4);
                        fVar38 = *(float *)(lVar4 + uVar27 * 4);
                        fVar78 = *(float *)(lVar4 + 4 + uVar27 * 4);
                        fVar79 = *(float *)(lVar4 + 8 + uVar27 * 4);
                        fVar80 = *(float *)(lVar29 + uVar27 * 4);
                        fVar99 = *(float *)(lVar29 + 4 + uVar27 * 4);
                        fVar109 = *(float *)(lVar29 + 8 + uVar27 * 4);
                        local_1988._4_4_ = fVar80 * fVar54 + fVar111 * fVar38;
                        local_1988._0_4_ = fVar80 * fVar53 + fVar110 * fVar38;
                        uStack_1980._0_4_ = fVar80 * fVar55 + fVar172 * fVar38;
                        uStack_1980._4_4_ = fVar80 * fVar91 + fVar175 * fVar38;
                        local_1898 = fVar99 * fVar53 + fVar110 * fVar78;
                        fStack_1894 = fVar99 * fVar54 + fVar111 * fVar78;
                        fStack_1890 = fVar99 * fVar55 + fVar172 * fVar78;
                        fStack_188c = fVar99 * fVar91 + fVar175 * fVar78;
                        local_18a8 = fVar109 * fVar53 + fVar110 * fVar79;
                        fStack_18a4 = fVar109 * fVar54 + fVar111 * fVar79;
                        fStack_18a0 = fVar109 * fVar55 + fVar172 * fVar79;
                        fStack_189c = fVar109 * fVar91 + fVar175 * fVar79;
                        uVar27 = (ulong)*(uint *)(lVar26 + 0x30 + uVar28 * 4);
                        fVar38 = *(float *)(lVar29 + uVar27 * 4);
                        fVar78 = *(float *)(lVar29 + 4 + uVar27 * 4);
                        fVar79 = *(float *)(lVar29 + 8 + uVar27 * 4);
                        fVar80 = *(float *)(lVar4 + uVar27 * 4);
                        auVar153._0_4_ = fVar110 * fVar80 + fVar53 * fVar38;
                        auVar153._4_4_ = fVar111 * fVar80 + fVar54 * fVar38;
                        auVar153._8_4_ = fVar172 * fVar80 + fVar55 * fVar38;
                        auVar153._12_4_ = fVar175 * fVar80 + fVar91 * fVar38;
                        fVar38 = *(float *)(lVar4 + 4 + uVar27 * 4);
                        auVar161._0_4_ = fVar110 * fVar38 + fVar53 * fVar78;
                        auVar161._4_4_ = fVar111 * fVar38 + fVar54 * fVar78;
                        auVar161._8_4_ = fVar172 * fVar38 + fVar55 * fVar78;
                        auVar161._12_4_ = fVar175 * fVar38 + fVar91 * fVar78;
                        fVar38 = *(float *)(lVar4 + 8 + uVar27 * 4);
                        auVar41._0_4_ = fVar110 * fVar38 + fVar53 * fVar79;
                        auVar41._4_4_ = fVar111 * fVar38 + fVar54 * fVar79;
                        auVar41._8_4_ = fVar172 * fVar38 + fVar55 * fVar79;
                        auVar41._12_4_ = fVar175 * fVar38 + fVar91 * fVar79;
                      }
                      else {
                        if (uVar32 != 0) {
                          lVar4 = *(long *)&pGVar3[2].numPrimitives;
                          local_1998 = (undefined1  [8])lVar4;
                          local_1a18 = (undefined1  [8])(lVar4 + 0x38);
                          uVar30 = (ulong)*(uint *)(lVar26 + uVar28 * 4);
                          uVar33 = uVar32;
                          uVar34 = uVar27;
                          do {
                            lVar29 = (long)itime.field_0.i[uVar34] * 0x38;
                            auVar52 = *(undefined1 (*) [16])(*(long *)(lVar4 + lVar29) + uVar30 * 4)
                            ;
                            auVar101 = *(undefined1 (*) [16])
                                        (*(long *)(lVar4 + 0x38 + lVar29) + uVar30 * 4);
                            *(int *)((long)&p0.field_0 + uVar34 * 4) = auVar52._0_4_;
                            uVar22 = vextractps_avx(auVar52,1);
                            *(undefined4 *)((long)&p0.field_0 + uVar34 * 4 + 0x10) = uVar22;
                            uVar22 = vextractps_avx(auVar52,2);
                            *(undefined4 *)((long)&p0.field_0 + uVar34 * 4 + 0x20) = uVar22;
                            *(int *)((long)&p1.field_0 + uVar34 * 4) = auVar101._0_4_;
                            uVar22 = vextractps_avx(auVar101,1);
                            *(undefined4 *)((long)&p1.field_0 + uVar34 * 4 + 0x10) = uVar22;
                            uVar22 = vextractps_avx(auVar101,2);
                            *(undefined4 *)((long)&p1.field_0 + uVar34 * 4 + 0x20) = uVar22;
                            uVar33 = uVar33 ^ 1L << (uVar34 & 0x3f);
                            uVar34 = 0;
                            if (uVar33 != 0) {
                              for (; (uVar33 >> uVar34 & 1) == 0; uVar34 = uVar34 + 1) {
                              }
                            }
                          } while (uVar33 != 0);
                          auVar8._8_8_ = p1.field_0._8_8_;
                          auVar8._0_8_ = p1.field_0._0_8_;
                          auVar101 = (undefined1  [16])p0.field_0.field_0.x.field_0;
                        }
                        auVar67._8_4_ = 0x3f800000;
                        auVar67._0_8_ = 0x3f8000003f800000;
                        auVar67._12_4_ = 0x3f800000;
                        auVar52 = vsubps_avx(auVar67,auVar56);
                        fVar38 = auVar52._0_4_;
                        fVar172 = fVar38 * (float)p0.field_0._16_4_;
                        fVar78 = auVar52._4_4_;
                        fVar175 = fVar78 * (float)p0.field_0._20_4_;
                        fVar79 = auVar52._8_4_;
                        fVar177 = fVar79 * (float)p0.field_0._24_4_;
                        fVar80 = auVar52._12_4_;
                        fVar179 = fVar80 * (float)p0.field_0._28_4_;
                        fVar180 = fVar38 * (float)p0.field_0._32_4_;
                        fVar182 = fVar78 * (float)p0.field_0._36_4_;
                        fVar183 = fVar79 * (float)p0.field_0._40_4_;
                        fVar184 = fVar80 * (float)p0.field_0._44_4_;
                        fVar185 = fVar53 * (float)p1.field_0._16_4_;
                        fVar190 = fVar54 * (float)p1.field_0._20_4_;
                        fVar192 = fVar55 * (float)p1.field_0._24_4_;
                        fVar194 = fVar91 * (float)p1.field_0._28_4_;
                        fVar99 = fVar53 * (float)p1.field_0._32_4_;
                        fVar109 = fVar54 * (float)p1.field_0._36_4_;
                        fVar110 = fVar55 * (float)p1.field_0._40_4_;
                        fVar111 = fVar91 * (float)p1.field_0._44_4_;
                        if (uVar32 != 0) {
                          lVar4 = *(long *)&pGVar3[2].numPrimitives;
                          local_1998 = (undefined1  [8])lVar4;
                          local_1a18 = (undefined1  [8])(lVar4 + 0x38);
                          uVar30 = (ulong)*(uint *)(lVar26 + 0x10 + uVar28 * 4);
                          uVar33 = uVar32;
                          uVar34 = uVar27;
                          do {
                            lVar29 = (long)itime.field_0.i[uVar34] * 0x38;
                            auVar52 = *(undefined1 (*) [16])(*(long *)(lVar4 + lVar29) + uVar30 * 4)
                            ;
                            auVar56 = *(undefined1 (*) [16])
                                       (*(long *)(lVar4 + 0x38 + lVar29) + uVar30 * 4);
                            *(int *)((long)&p0.field_0 + uVar34 * 4) = auVar52._0_4_;
                            uVar22 = vextractps_avx(auVar52,1);
                            *(undefined4 *)((long)&p0.field_0 + uVar34 * 4 + 0x10) = uVar22;
                            uVar22 = vextractps_avx(auVar52,2);
                            *(undefined4 *)((long)&p0.field_0 + uVar34 * 4 + 0x20) = uVar22;
                            *(int *)((long)&p1.field_0 + uVar34 * 4) = auVar56._0_4_;
                            uVar22 = vextractps_avx(auVar56,1);
                            *(undefined4 *)((long)&p1.field_0 + uVar34 * 4 + 0x10) = uVar22;
                            uVar22 = vextractps_avx(auVar56,2);
                            *(undefined4 *)((long)&p1.field_0 + uVar34 * 4 + 0x20) = uVar22;
                            uVar33 = uVar33 ^ 1L << (uVar34 & 0x3f);
                            uVar34 = 0;
                            if (uVar33 != 0) {
                              for (; (uVar33 >> uVar34 & 1) == 0; uVar34 = uVar34 + 1) {
                              }
                            }
                          } while (uVar33 != 0);
                          local_18a8 = p0.field_0._0_4_;
                          fStack_18a4 = p0.field_0._4_4_;
                          fStack_18a0 = p0.field_0._8_4_;
                          fStack_189c = p0.field_0._12_4_;
                          auVar196._8_8_ = p1.field_0._8_8_;
                          auVar196._0_8_ = p1.field_0._0_8_;
                        }
                        fVar112 = fVar38 * (float)p0.field_0._16_4_;
                        fVar127 = fVar78 * (float)p0.field_0._20_4_;
                        fVar131 = fVar79 * (float)p0.field_0._24_4_;
                        fVar135 = fVar80 * (float)p0.field_0._28_4_;
                        fVar113 = fVar38 * (float)p0.field_0._32_4_;
                        fVar128 = fVar78 * (float)p0.field_0._36_4_;
                        fVar132 = fVar79 * (float)p0.field_0._40_4_;
                        fVar136 = fVar80 * (float)p0.field_0._44_4_;
                        fVar114 = fVar53 * (float)p1.field_0._16_4_;
                        fVar129 = fVar54 * (float)p1.field_0._20_4_;
                        fVar133 = fVar55 * (float)p1.field_0._24_4_;
                        fVar137 = fVar91 * (float)p1.field_0._28_4_;
                        fVar115 = fVar53 * (float)p1.field_0._32_4_;
                        fVar130 = fVar54 * (float)p1.field_0._36_4_;
                        fVar134 = fVar55 * (float)p1.field_0._40_4_;
                        fVar138 = fVar91 * (float)p1.field_0._44_4_;
                        if (uVar32 != 0) {
                          lVar4 = *(long *)&pGVar3[2].numPrimitives;
                          uVar30 = (ulong)*(uint *)(lVar26 + 0x20 + uVar28 * 4);
                          uVar33 = uVar32;
                          uVar34 = uVar27;
                          do {
                            lVar29 = (long)itime.field_0.i[uVar34] * 0x38;
                            auVar52 = *(undefined1 (*) [16])(*(long *)(lVar4 + lVar29) + uVar30 * 4)
                            ;
                            auVar56 = *(undefined1 (*) [16])
                                       (*(long *)(lVar4 + 0x38 + lVar29) + uVar30 * 4);
                            *(int *)((long)&p0.field_0 + uVar34 * 4) = auVar52._0_4_;
                            uVar22 = vextractps_avx(auVar52,1);
                            *(undefined4 *)((long)&p0.field_0 + uVar34 * 4 + 0x10) = uVar22;
                            uVar22 = vextractps_avx(auVar52,2);
                            *(undefined4 *)((long)&p0.field_0 + uVar34 * 4 + 0x20) = uVar22;
                            *(int *)((long)&p1.field_0 + uVar34 * 4) = auVar56._0_4_;
                            uVar22 = vextractps_avx(auVar56,1);
                            *(undefined4 *)((long)&p1.field_0 + uVar34 * 4 + 0x10) = uVar22;
                            uVar22 = vextractps_avx(auVar56,2);
                            *(undefined4 *)((long)&p1.field_0 + uVar34 * 4 + 0x20) = uVar22;
                            uVar33 = uVar33 ^ 1L << (uVar34 & 0x3f);
                            uVar34 = 0;
                            if (uVar33 != 0) {
                              for (; (uVar33 >> uVar34 & 1) == 0; uVar34 = uVar34 + 1) {
                              }
                            }
                          } while (uVar33 != 0);
                          _local_1998 = p0.field_0._0_16_;
                          _fStack_1a10 = p1.field_0._8_8_;
                          local_1a18 = (undefined1  [8])p1.field_0._0_8_;
                        }
                        local_1898 = fVar38 * (float)p0.field_0._16_4_;
                        fStack_1894 = fVar78 * (float)p0.field_0._20_4_;
                        fStack_1890 = fVar79 * (float)p0.field_0._24_4_;
                        fStack_188c = fVar80 * (float)p0.field_0._28_4_;
                        fVar139 = fVar38 * (float)p0.field_0._32_4_;
                        fVar146 = fVar78 * (float)p0.field_0._36_4_;
                        fVar147 = fVar79 * (float)p0.field_0._40_4_;
                        fVar148 = fVar80 * (float)p0.field_0._44_4_;
                        fVar149 = fVar53 * (float)p1.field_0._16_4_;
                        fVar156 = fVar54 * (float)p1.field_0._20_4_;
                        fVar157 = fVar55 * (float)p1.field_0._24_4_;
                        fVar158 = fVar91 * (float)p1.field_0._28_4_;
                        fVar159 = fVar53 * (float)p1.field_0._32_4_;
                        fVar162 = fVar54 * (float)p1.field_0._36_4_;
                        fVar163 = fVar55 * (float)p1.field_0._40_4_;
                        fVar164 = fVar91 * (float)p1.field_0._44_4_;
                        auVar52 = in_ZMM10._0_16_;
                        if (uVar32 != 0) {
                          lVar4 = *(long *)&pGVar3[2].numPrimitives;
                          uVar33 = (ulong)*(uint *)(lVar26 + 0x30 + uVar28 * 4);
                          uVar34 = uVar32;
                          do {
                            lVar29 = (long)itime.field_0.i[uVar27] * 0x38;
                            auVar52 = *(undefined1 (*) [16])(*(long *)(lVar4 + lVar29) + uVar33 * 4)
                            ;
                            auVar56 = *(undefined1 (*) [16])
                                       (*(long *)(lVar4 + 0x38 + lVar29) + uVar33 * 4);
                            *(int *)((long)&p0.field_0 + uVar27 * 4) = auVar52._0_4_;
                            uVar22 = vextractps_avx(auVar52,1);
                            *(undefined4 *)((long)&p0.field_0 + uVar27 * 4 + 0x10) = uVar22;
                            uVar22 = vextractps_avx(auVar52,2);
                            *(undefined4 *)((long)&p0.field_0 + uVar27 * 4 + 0x20) = uVar22;
                            *(int *)((long)&p1.field_0 + uVar27 * 4) = auVar56._0_4_;
                            uVar22 = vextractps_avx(auVar56,1);
                            *(undefined4 *)((long)&p1.field_0 + uVar27 * 4 + 0x10) = uVar22;
                            uVar22 = vextractps_avx(auVar56,2);
                            *(undefined4 *)((long)&p1.field_0 + uVar27 * 4 + 0x20) = uVar22;
                            uVar34 = uVar34 ^ 1L << (uVar27 & 0x3f);
                            uVar27 = 0;
                            if (uVar34 != 0) {
                              for (; (uVar34 >> uVar27 & 1) == 0; uVar27 = uVar27 + 1) {
                              }
                            }
                          } while (uVar34 != 0);
                          auVar166._8_8_ = p1.field_0._8_8_;
                          auVar166._0_8_ = p1.field_0._0_8_;
                          auVar52 = (undefined1  [16])p0.field_0.field_0.x.field_0;
                        }
                        auVar203._0_4_ = fVar38 * auVar101._0_4_ + fVar53 * auVar8._0_4_;
                        auVar203._4_4_ = fVar78 * auVar101._4_4_ + fVar54 * auVar8._4_4_;
                        auVar203._8_4_ = fVar79 * auVar101._8_4_ + fVar55 * auVar8._8_4_;
                        auVar203._12_4_ = fVar80 * auVar101._12_4_ + fVar91 * auVar8._12_4_;
                        auVar94._0_4_ = fVar172 + fVar185;
                        auVar94._4_4_ = fVar175 + fVar190;
                        auVar94._8_4_ = fVar177 + fVar192;
                        auVar94._12_4_ = fVar179 + fVar194;
                        auVar105._0_4_ = fVar180 + fVar99;
                        auVar105._4_4_ = fVar182 + fVar109;
                        auVar105._8_4_ = fVar183 + fVar110;
                        auVar105._12_4_ = fVar184 + fVar111;
                        auVar82._0_4_ = fVar38 * local_18a8 + auVar196._0_4_ * fVar53;
                        auVar82._4_4_ = fVar78 * fStack_18a4 + auVar196._4_4_ * fVar54;
                        auVar82._8_4_ = fVar79 * fStack_18a0 + auVar196._8_4_ * fVar55;
                        auVar82._12_4_ = fVar80 * fStack_189c + auVar196._12_4_ * fVar91;
                        auVar197._0_4_ = fVar114 + fVar112;
                        auVar197._4_4_ = fVar129 + fVar127;
                        auVar197._8_4_ = fVar133 + fVar131;
                        auVar197._12_4_ = fVar137 + fVar135;
                        aVar187._0_4_ = fVar115 + fVar113;
                        aVar187._4_4_ = fVar130 + fVar128;
                        aVar187._8_4_ = fVar134 + fVar132;
                        aVar187._12_4_ = fVar138 + fVar136;
                        local_1988._4_4_ =
                             fVar78 * (float)local_1998._4_4_ + fVar54 * (float)local_1a18._4_4_;
                        local_1988._0_4_ =
                             fVar38 * (float)local_1998._0_4_ + fVar53 * (float)local_1a18._0_4_;
                        uStack_1980._0_4_ = fVar79 * fStack_1990 + fVar55 * fStack_1a10;
                        uStack_1980._4_4_ = fVar80 * fStack_198c + fVar91 * fStack_1a0c;
                        local_1898 = local_1898 + fVar149;
                        fStack_1894 = fStack_1894 + fVar156;
                        fStack_1890 = fStack_1890 + fVar157;
                        fStack_188c = fStack_188c + fVar158;
                        local_18a8 = fVar159 + fVar139;
                        fStack_18a4 = fVar162 + fVar146;
                        fStack_18a0 = fVar163 + fVar147;
                        fStack_189c = fVar164 + fVar148;
                        auVar153._0_4_ = auVar52._0_4_ * fVar38 + auVar166._0_4_ * fVar53;
                        auVar153._4_4_ = auVar52._4_4_ * fVar78 + auVar166._4_4_ * fVar54;
                        auVar153._8_4_ = auVar52._8_4_ * fVar79 + auVar166._8_4_ * fVar55;
                        auVar153._12_4_ = auVar52._12_4_ * fVar80 + auVar166._12_4_ * fVar91;
                        auVar161._0_4_ =
                             fVar38 * (float)p0.field_0._16_4_ + fVar53 * (float)p1.field_0._16_4_;
                        auVar161._4_4_ =
                             fVar78 * (float)p0.field_0._20_4_ + fVar54 * (float)p1.field_0._20_4_;
                        auVar161._8_4_ =
                             fVar79 * (float)p0.field_0._24_4_ + fVar55 * (float)p1.field_0._24_4_;
                        auVar161._12_4_ =
                             fVar80 * (float)p0.field_0._28_4_ + fVar91 * (float)p1.field_0._28_4_;
                        auVar41._0_4_ =
                             fVar38 * (float)p0.field_0._32_4_ + fVar53 * (float)p1.field_0._32_4_;
                        auVar41._4_4_ =
                             fVar78 * (float)p0.field_0._36_4_ + fVar54 * (float)p1.field_0._36_4_;
                        auVar41._8_4_ =
                             fVar79 * (float)p0.field_0._40_4_ + fVar55 * (float)p1.field_0._40_4_;
                        auVar41._12_4_ =
                             fVar80 * (float)p0.field_0._44_4_ + fVar91 * (float)p1.field_0._44_4_;
                      }
                      auVar52 = vsubps_avx(auVar203,auVar82);
                      auVar56 = vsubps_avx(auVar94,auVar197);
                      auVar101 = vsubps_avx(auVar105,(undefined1  [16])aVar187);
                      auVar100 = vsubps_avx(auVar153,auVar203);
                      auVar92 = vsubps_avx(auVar161,auVar94);
                      auVar116 = vsubps_avx(auVar41,auVar105);
                      fVar53 = auVar116._0_4_;
                      fVar131 = auVar56._0_4_;
                      auVar59._0_4_ = fVar131 * fVar53;
                      fVar38 = auVar116._4_4_;
                      fVar133 = auVar56._4_4_;
                      auVar59._4_4_ = fVar133 * fVar38;
                      fVar99 = auVar116._8_4_;
                      fVar135 = auVar56._8_4_;
                      auVar59._8_4_ = fVar135 * fVar99;
                      fVar172 = auVar116._12_4_;
                      fVar137 = auVar56._12_4_;
                      auVar59._12_4_ = fVar137 * fVar172;
                      fVar54 = auVar101._0_4_;
                      fVar149 = auVar92._0_4_;
                      auVar121._0_4_ = fVar149 * fVar54;
                      fVar78 = auVar101._4_4_;
                      fVar156 = auVar92._4_4_;
                      auVar121._4_4_ = fVar156 * fVar78;
                      fVar109 = auVar101._8_4_;
                      fVar157 = auVar92._8_4_;
                      auVar121._8_4_ = fVar157 * fVar109;
                      fVar175 = auVar101._12_4_;
                      fVar158 = auVar92._12_4_;
                      auVar121._12_4_ = fVar158 * fVar175;
                      _local_1998 = vsubps_avx(auVar121,auVar59);
                      fVar139 = auVar100._0_4_;
                      auVar60._0_4_ = fVar139 * fVar54;
                      fVar146 = auVar100._4_4_;
                      auVar60._4_4_ = fVar146 * fVar78;
                      fVar147 = auVar100._8_4_;
                      auVar60._8_4_ = fVar147 * fVar109;
                      fVar148 = auVar100._12_4_;
                      auVar60._12_4_ = fVar148 * fVar175;
                      fVar127 = auVar52._0_4_;
                      auVar122._0_4_ = fVar127 * fVar53;
                      fVar128 = auVar52._4_4_;
                      auVar122._4_4_ = fVar128 * fVar38;
                      fVar129 = auVar52._8_4_;
                      auVar122._8_4_ = fVar129 * fVar99;
                      fVar130 = auVar52._12_4_;
                      auVar122._12_4_ = fVar130 * fVar172;
                      auVar56 = vsubps_avx(auVar122,auVar60);
                      auVar123._0_4_ = fVar149 * fVar127;
                      auVar123._4_4_ = fVar156 * fVar128;
                      auVar123._8_4_ = fVar157 * fVar129;
                      auVar123._12_4_ = fVar158 * fVar130;
                      auVar154._0_4_ = fVar139 * fVar131;
                      auVar154._4_4_ = fVar146 * fVar133;
                      auVar154._8_4_ = fVar147 * fVar135;
                      auVar154._12_4_ = fVar148 * fVar137;
                      auVar101 = vsubps_avx(auVar154,auVar123);
                      auVar52 = vsubps_avx(auVar203,*(undefined1 (*) [16])ray);
                      auVar100 = vsubps_avx(auVar94,*(undefined1 (*) [16])(ray + 0x10));
                      auVar92 = vsubps_avx(auVar105,*(undefined1 (*) [16])(ray + 0x20));
                      auVar168 = ZEXT1664(auVar92);
                      fVar180 = *(float *)(ray + 0x50);
                      fVar182 = *(float *)(ray + 0x54);
                      fVar183 = *(float *)(ray + 0x58);
                      fVar184 = *(float *)(ray + 0x5c);
                      fVar185 = *(float *)(ray + 0x60);
                      fVar190 = *(float *)(ray + 100);
                      fVar192 = *(float *)(ray + 0x68);
                      fVar194 = *(float *)(ray + 0x6c);
                      fVar132 = auVar92._0_4_;
                      auVar106._0_4_ = fVar132 * fVar180;
                      fVar134 = auVar92._4_4_;
                      auVar106._4_4_ = fVar134 * fVar182;
                      fVar136 = auVar92._8_4_;
                      auVar106._8_4_ = fVar136 * fVar183;
                      fVar138 = auVar92._12_4_;
                      auVar106._12_4_ = fVar138 * fVar184;
                      fVar55 = auVar100._0_4_;
                      auVar198._0_4_ = fVar185 * fVar55;
                      fVar79 = auVar100._4_4_;
                      auVar198._4_4_ = fVar190 * fVar79;
                      fVar110 = auVar100._8_4_;
                      auVar198._8_4_ = fVar192 * fVar110;
                      fVar177 = auVar100._12_4_;
                      auVar198._12_4_ = fVar194 * fVar177;
                      auVar100 = vsubps_avx(auVar198,auVar106);
                      fVar112 = *(float *)(ray + 0x40);
                      fVar113 = *(float *)(ray + 0x44);
                      fVar114 = *(float *)(ray + 0x48);
                      fVar115 = *(float *)(ray + 0x4c);
                      fVar91 = auVar52._0_4_;
                      auVar199._0_4_ = fVar185 * fVar91;
                      fVar80 = auVar52._4_4_;
                      auVar199._4_4_ = fVar190 * fVar80;
                      fVar111 = auVar52._8_4_;
                      auVar199._8_4_ = fVar192 * fVar111;
                      fVar179 = auVar52._12_4_;
                      auVar199._12_4_ = fVar194 * fVar179;
                      auVar204._0_4_ = fVar132 * fVar112;
                      auVar204._4_4_ = fVar134 * fVar113;
                      auVar204._8_4_ = fVar136 * fVar114;
                      auVar204._12_4_ = fVar138 * fVar115;
                      auVar92 = vsubps_avx(auVar204,auVar199);
                      in_ZMM14 = ZEXT1664(auVar92);
                      auVar205._0_4_ = fVar55 * fVar112;
                      auVar205._4_4_ = fVar79 * fVar113;
                      auVar205._8_4_ = fVar110 * fVar114;
                      auVar205._12_4_ = fVar177 * fVar115;
                      auVar124._0_4_ = fVar91 * fVar180;
                      auVar124._4_4_ = fVar80 * fVar182;
                      auVar124._8_4_ = fVar111 * fVar183;
                      auVar124._12_4_ = fVar179 * fVar184;
                      auVar116 = vsubps_avx(auVar124,auVar205);
                      auVar169._0_4_ =
                           local_1998._0_4_ * fVar112 +
                           auVar56._0_4_ * fVar180 + auVar101._0_4_ * fVar185;
                      auVar169._4_4_ =
                           local_1998._4_4_ * fVar113 +
                           auVar56._4_4_ * fVar182 + auVar101._4_4_ * fVar190;
                      auVar169._8_4_ =
                           local_1998._8_4_ * fVar114 +
                           auVar56._8_4_ * fVar183 + auVar101._8_4_ * fVar192;
                      auVar169._12_4_ =
                           local_1998._12_4_ * fVar115 +
                           auVar56._12_4_ * fVar184 + auVar101._12_4_ * fVar194;
                      in_ZMM10 = ZEXT1664(auVar169);
                      auVar61._8_4_ = 0x80000000;
                      auVar61._0_8_ = 0x8000000080000000;
                      auVar61._12_4_ = 0x80000000;
                      auVar52 = vandps_avx(auVar169,auVar61);
                      auVar62._0_4_ = fVar139 * auVar100._0_4_;
                      auVar62._4_4_ = fVar146 * auVar100._4_4_;
                      auVar62._8_4_ = fVar147 * auVar100._8_4_;
                      auVar62._12_4_ = fVar148 * auVar100._12_4_;
                      uVar176 = auVar52._0_4_;
                      auVar95._0_4_ =
                           (float)(uVar176 ^
                                  (uint)(auVar62._0_4_ +
                                        fVar149 * auVar92._0_4_ + auVar116._0_4_ * fVar53));
                      uVar178 = auVar52._4_4_;
                      auVar95._4_4_ =
                           (float)(uVar178 ^
                                  (uint)(auVar62._4_4_ +
                                        fVar156 * auVar92._4_4_ + auVar116._4_4_ * fVar38));
                      uVar191 = auVar52._8_4_;
                      auVar95._8_4_ =
                           (float)(uVar191 ^
                                  (uint)(auVar62._8_4_ +
                                        fVar157 * auVar92._8_4_ + auVar116._8_4_ * fVar99));
                      uVar193 = auVar52._12_4_;
                      auVar95._12_4_ =
                           (float)(uVar193 ^
                                  (uint)(auVar62._12_4_ +
                                        fVar158 * auVar92._12_4_ + auVar116._12_4_ * fVar172));
                      auVar52 = vcmpps_avx(auVar95,_DAT_01f7aa10,5);
                      auVar117 = auVar43 & auVar52;
                      if ((((auVar117 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                           (auVar117 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar117 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          -1 < auVar117[0xf]) {
                        auVar52 = vpcmpeqd_avx(auVar62,auVar62);
                        auVar77 = ZEXT1664(auVar52);
                      }
                      else {
                        auVar52 = vandps_avx(auVar52,auVar43);
                        auVar68._0_4_ = auVar100._0_4_ * fVar127;
                        auVar68._4_4_ = auVar100._4_4_ * fVar128;
                        auVar68._8_4_ = auVar100._8_4_ * fVar129;
                        auVar68._12_4_ = auVar100._12_4_ * fVar130;
                        auVar108._0_4_ =
                             (float)(uVar176 ^
                                    (uint)(auVar68._0_4_ +
                                          auVar92._0_4_ * fVar131 + fVar54 * auVar116._0_4_));
                        auVar108._4_4_ =
                             (float)(uVar178 ^
                                    (uint)(auVar68._4_4_ +
                                          auVar92._4_4_ * fVar133 + fVar78 * auVar116._4_4_));
                        auVar108._8_4_ =
                             (float)(uVar191 ^
                                    (uint)(auVar68._8_4_ +
                                          auVar92._8_4_ * fVar135 + fVar109 * auVar116._8_4_));
                        auVar108._12_4_ =
                             (float)(uVar193 ^
                                    (uint)(auVar68._12_4_ +
                                          auVar92._12_4_ * fVar137 + fVar175 * auVar116._12_4_));
                        auVar100 = vcmpps_avx(auVar108,_DAT_01f7aa10,5);
                        auVar116 = auVar52 & auVar100;
                        if ((((auVar116 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                             (auVar116 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                            (auVar116 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                            -1 < auVar116[0xf]) {
                          auVar117 = vpcmpeqd_avx(auVar68,auVar68);
                        }
                        else {
                          auVar44._8_4_ = 0x7fffffff;
                          auVar44._0_8_ = 0x7fffffff7fffffff;
                          auVar44._12_4_ = 0x7fffffff;
                          auVar116 = vandps_avx(auVar169,auVar44);
                          auVar168 = ZEXT1664(auVar116);
                          auVar52 = vandps_avx(auVar52,auVar100);
                          auVar100 = vsubps_avx(auVar116,auVar95);
                          auVar100 = vcmpps_avx(auVar100,auVar108,5);
                          auVar140 = auVar52 & auVar100;
                          auVar117 = vpcmpeqd_avx(auVar68,auVar68);
                          if ((((auVar140 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0
                               || (auVar140 >> 0x3f & (undefined1  [16])0x1) !=
                                  (undefined1  [16])0x0) ||
                              (auVar140 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                              || auVar140[0xf] < '\0') {
                            auVar52 = vandps_avx(auVar100,auVar52);
                            auVar145._0_4_ =
                                 (float)(uVar176 ^
                                        (uint)(local_1998._0_4_ * fVar91 +
                                              fVar55 * auVar56._0_4_ + fVar132 * auVar101._0_4_));
                            auVar145._4_4_ =
                                 (float)(uVar178 ^
                                        (uint)(local_1998._4_4_ * fVar80 +
                                              fVar79 * auVar56._4_4_ + fVar134 * auVar101._4_4_));
                            auVar145._8_4_ =
                                 (float)(uVar191 ^
                                        (uint)(local_1998._8_4_ * fVar111 +
                                              fVar110 * auVar56._8_4_ + fVar136 * auVar101._8_4_));
                            auVar145._12_4_ =
                                 (float)(uVar193 ^
                                        (uint)(local_1998._12_4_ * fVar179 +
                                              fVar177 * auVar56._12_4_ + fVar138 * auVar101._12_4_))
                            ;
                            fVar53 = auVar116._0_4_;
                            auVar45._0_4_ = fVar53 * *(float *)(ray + 0x30);
                            fVar54 = auVar116._4_4_;
                            auVar45._4_4_ = fVar54 * *(float *)(ray + 0x34);
                            fVar55 = auVar116._8_4_;
                            auVar45._8_4_ = fVar55 * *(float *)(ray + 0x38);
                            fVar91 = auVar116._12_4_;
                            auVar45._12_4_ = fVar91 * *(float *)(ray + 0x3c);
                            auVar100 = vcmpps_avx(auVar45,auVar145,1);
                            auVar141 = *(undefined1 (*) [16])(ray + 0x80);
                            auVar70._0_4_ = fVar53 * *(float *)(ray + 0x80);
                            auVar70._4_4_ = fVar54 * *(float *)(ray + 0x84);
                            auVar70._8_4_ = fVar55 * *(float *)(ray + 0x88);
                            auVar70._12_4_ = fVar91 * *(float *)(ray + 0x8c);
                            auVar117 = vcmpps_avx(auVar145,auVar70,2);
                            auVar100 = vandps_avx(auVar117,auVar100);
                            auVar140 = auVar52 & auVar100;
                            if ((((auVar140 >> 0x1f & (undefined1  [16])0x1) ==
                                  (undefined1  [16])0x0 &&
                                 (auVar140 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0
                                 ) && (auVar140 >> 0x5f & (undefined1  [16])0x1) ==
                                      (undefined1  [16])0x0) && -1 < auVar140[0xf]) {
LAB_002ff452:
                              auVar52 = vpcmpeqd_avx(auVar117,auVar117);
                            }
                            else {
                              auVar52 = vandps_avx(auVar52,auVar100);
                              auVar100 = vcmpps_avx(auVar169,_DAT_01f7aa10,4);
                              auVar140 = auVar52 & auVar100;
                              if ((((auVar140 >> 0x1f & (undefined1  [16])0x1) ==
                                    (undefined1  [16])0x0 &&
                                   (auVar140 >> 0x3f & (undefined1  [16])0x1) ==
                                   (undefined1  [16])0x0) &&
                                  (auVar140 >> 0x5f & (undefined1  [16])0x1) ==
                                  (undefined1  [16])0x0) && -1 < auVar140[0xf]) goto LAB_002ff452;
                              auVar117 = vandps_avx(auVar100,auVar52);
                              uVar176 = pGVar3->mask;
                              auVar46._4_4_ = uVar176;
                              auVar46._0_4_ = uVar176;
                              auVar46._8_4_ = uVar176;
                              auVar46._12_4_ = uVar176;
                              auVar52 = vandps_avx(auVar46,*(undefined1 (*) [16])(ray + 0x90));
                              auVar52 = vpcmpeqd_avx(auVar52,_DAT_01f7aa10);
                              auVar100 = auVar117 & ~auVar52;
                              if ((((auVar100 >> 0x1f & (undefined1  [16])0x1) ==
                                    (undefined1  [16])0x0 &&
                                   (auVar100 >> 0x3f & (undefined1  [16])0x1) ==
                                   (undefined1  [16])0x0) &&
                                  (auVar100 >> 0x5f & (undefined1  [16])0x1) ==
                                  (undefined1  [16])0x0) && -1 < auVar100[0xf]) goto LAB_002ff452;
                              aVar98 = (anon_union_16_2_9473010e_for_vint_impl<4>_1)
                                       vandnps_avx(auVar52,auVar117);
                              in_ZMM10 = ZEXT1664((undefined1  [16])aVar98);
                              if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                                 (pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                                auVar52 = vrcpps_avx(auVar116);
                                fVar38 = auVar52._0_4_;
                                auVar72._0_4_ = fVar53 * fVar38;
                                fVar53 = auVar52._4_4_;
                                auVar72._4_4_ = fVar54 * fVar53;
                                fVar54 = auVar52._8_4_;
                                auVar72._8_4_ = fVar55 * fVar54;
                                fVar55 = auVar52._12_4_;
                                auVar72._12_4_ = fVar91 * fVar55;
                                auVar126._8_4_ = 0x3f800000;
                                auVar126._0_8_ = 0x3f8000003f800000;
                                auVar126._12_4_ = 0x3f800000;
                                auVar52 = vsubps_avx(auVar126,auVar72);
                                fVar38 = fVar38 + fVar38 * auVar52._0_4_;
                                fVar53 = fVar53 + fVar53 * auVar52._4_4_;
                                fVar54 = fVar54 + fVar54 * auVar52._8_4_;
                                fVar55 = fVar55 + fVar55 * auVar52._12_4_;
                                auVar73._0_4_ = fVar38 * auVar95._0_4_;
                                auVar73._4_4_ = fVar53 * auVar95._4_4_;
                                auVar73._8_4_ = fVar54 * auVar95._8_4_;
                                auVar73._12_4_ = fVar55 * auVar95._12_4_;
                                auVar52 = vminps_avx(auVar73,auVar126);
                                auVar97._0_4_ = fVar38 * auVar108._0_4_;
                                auVar97._4_4_ = fVar53 * auVar108._4_4_;
                                auVar97._8_4_ = fVar54 * auVar108._8_4_;
                                auVar97._12_4_ = fVar55 * auVar108._12_4_;
                                auVar100 = vminps_avx(auVar97,auVar126);
                                auVar117 = vsubps_avx(auVar126,auVar52);
                                auVar140 = vsubps_avx(auVar126,auVar100);
                                auVar15._8_8_ = uVar17;
                                auVar15._0_8_ = uVar16;
                                auVar52 = vblendvps_avx(auVar52,auVar117,auVar15);
                                vblendvps_avx(auVar100,auVar140,auVar15);
                                vpshufd_avx(ZEXT416(uVar174),0);
                                vpshufd_avx(ZEXT416(uVar171),0);
                                p0.field_0._0_16_ = _local_1998;
                                local_1868 = auVar56._0_8_;
                                uStack_1860 = auVar56._8_8_;
                                p0.field_0._16_8_ = local_1868;
                                p0.field_0._24_8_ = uStack_1860;
                                p0.field_0._32_16_ = auVar101;
                                auVar50._0_4_ = fVar38 * auVar145._0_4_;
                                auVar50._4_4_ = fVar53 * auVar145._4_4_;
                                auVar50._8_4_ = fVar54 * auVar145._8_4_;
                                auVar50._12_4_ = fVar55 * auVar145._12_4_;
                                vcmpps_avx(ZEXT1632(auVar52),ZEXT1632(auVar52),0xf);
                                auVar52 = vblendvps_avx(auVar141,auVar50,(undefined1  [16])aVar98);
                                *(undefined1 (*) [16])(ray + 0x80) = auVar52;
                                itime.field_0 = aVar98;
                                p1.field_0._0_8_ = &itime;
                                p1.field_0._8_8_ = pGVar3->userPtr;
                                p1.field_0._16_8_ = context->user;
                                p1.field_0._24_8_ = ray;
                                p1.field_0._32_8_ = &p0;
                                p1.field_0._40_4_ = 4;
                                if (pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                                  auVar168 = ZEXT1664(auVar116);
                                  in_ZMM14 = ZEXT1664(auVar92);
                                  (*pGVar3->occlusionFilterN)((RTCFilterFunctionNArguments *)&p1);
                                  in_ZMM10 = ZEXT1664((undefined1  [16])itime.field_0);
                                }
                                auVar170 = in_ZMM10._16_48_;
                                if (in_ZMM10._0_16_ == (undefined1  [16])0x0) {
                                  auVar52 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
                                  auVar52 = auVar52 ^ _DAT_01f7ae20;
                                }
                                else {
                                  p_Var5 = context->args->filter;
                                  if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                                     (((context->args->flags &
                                       RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                       RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                      (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
                                    auVar168 = ZEXT1664(auVar168._0_16_);
                                    in_ZMM14 = ZEXT1664(in_ZMM14._0_16_);
                                    (*p_Var5)((RTCFilterFunctionNArguments *)&p1);
                                    in_ZMM10 = ZEXT1664((undefined1  [16])itime.field_0);
                                  }
                                  auVar170 = in_ZMM10._16_48_;
                                  auVar56 = vpcmpeqd_avx(in_ZMM10._0_16_,_DAT_01f7aa10);
                                  auVar52 = auVar56 ^ _DAT_01f7ae20;
                                  auVar86._8_4_ = 0xff800000;
                                  auVar86._0_8_ = 0xff800000ff800000;
                                  auVar86._12_4_ = 0xff800000;
                                  auVar56 = vblendvps_avx(auVar86,*(undefined1 (*) [16])
                                                                   (p1.field_0._24_8_ + 0x80),
                                                          auVar56);
                                  *(undefined1 (*) [16])(p1.field_0._24_8_ + 0x80) = auVar56;
                                }
                                auVar52 = vpslld_avx(auVar52,0x1f);
                                in_ZMM10._0_16_ = vpsrad_avx(auVar52,0x1f);
                                in_ZMM10._16_48_ = auVar170;
                                auVar52 = vblendvps_avx(auVar141,*(undefined1 (*) [16])pRVar1,
                                                        auVar52);
                                *(undefined1 (*) [16])pRVar1 = auVar52;
                                auVar117 = auVar141;
                              }
                              auVar43 = vpandn_avx(in_ZMM10._0_16_,auVar43);
                              auVar52 = vpcmpeqd_avx(auVar117,auVar117);
                            }
                            auVar77 = ZEXT1664(auVar52);
                            goto LAB_002febab;
                          }
                        }
                        auVar77 = ZEXT1664(auVar117);
                      }
LAB_002febab:
                      _local_1a18 = aVar187;
                      if ((((auVar43 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                           (auVar43 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar43 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          -1 < auVar43[0xf]) break;
                      _local_1a18 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                                    vsubps_avx(_local_1988,auVar153);
                      auVar10._4_4_ = fStack_1894;
                      auVar10._0_4_ = local_1898;
                      auVar10._8_4_ = fStack_1890;
                      auVar10._12_4_ = fStack_188c;
                      _local_1998 = vsubps_avx(auVar10,auVar161);
                      auVar9._4_4_ = fStack_18a4;
                      auVar9._0_4_ = local_18a8;
                      auVar9._8_4_ = fStack_18a0;
                      auVar9._12_4_ = fStack_189c;
                      auVar52 = vsubps_avx(auVar9,auVar41);
                      auVar56 = vsubps_avx(auVar82,_local_1988);
                      auVar101 = vsubps_avx(auVar197,auVar10);
                      auVar100 = vsubps_avx((undefined1  [16])aVar187,auVar9);
                      fVar53 = auVar100._0_4_;
                      fVar149 = local_1998._0_4_;
                      auVar42._0_4_ = fVar149 * fVar53;
                      fVar38 = auVar100._4_4_;
                      fVar156 = local_1998._4_4_;
                      auVar42._4_4_ = fVar156 * fVar38;
                      fVar99 = auVar100._8_4_;
                      fVar157 = local_1998._8_4_;
                      auVar42._8_4_ = fVar157 * fVar99;
                      fVar172 = auVar100._12_4_;
                      fVar158 = local_1998._12_4_;
                      auVar42._12_4_ = fVar158 * fVar172;
                      fVar54 = auVar52._0_4_;
                      fVar139 = auVar101._0_4_;
                      auVar63._0_4_ = fVar139 * fVar54;
                      fVar78 = auVar52._4_4_;
                      fVar146 = auVar101._4_4_;
                      auVar63._4_4_ = fVar146 * fVar78;
                      fVar109 = auVar52._8_4_;
                      fVar147 = auVar101._8_4_;
                      auVar63._8_4_ = fVar147 * fVar109;
                      fVar175 = auVar52._12_4_;
                      fVar148 = auVar101._12_4_;
                      auVar63._12_4_ = fVar148 * fVar175;
                      auVar101 = vsubps_avx(auVar63,auVar42);
                      fVar55 = auVar56._0_4_;
                      auVar64._0_4_ = fVar54 * fVar55;
                      fVar79 = auVar56._4_4_;
                      auVar64._4_4_ = fVar78 * fVar79;
                      fVar110 = auVar56._8_4_;
                      auVar64._8_4_ = fVar109 * fVar110;
                      fVar177 = auVar56._12_4_;
                      auVar64._12_4_ = fVar175 * fVar177;
                      fVar91 = local_1a18._0_4_;
                      auVar83._0_4_ = fVar53 * fVar91;
                      fVar80 = local_1a18._4_4_;
                      auVar83._4_4_ = fVar38 * fVar80;
                      fVar111 = local_1a18._8_4_;
                      auVar83._8_4_ = fVar99 * fVar111;
                      fVar179 = local_1a18._12_4_;
                      auVar83._12_4_ = fVar172 * fVar179;
                      auVar56 = vsubps_avx(auVar83,auVar64);
                      auVar84._0_4_ = fVar139 * fVar91;
                      auVar84._4_4_ = fVar146 * fVar80;
                      auVar84._8_4_ = fVar147 * fVar111;
                      auVar84._12_4_ = fVar148 * fVar179;
                      auVar96._0_4_ = fVar149 * fVar55;
                      auVar96._4_4_ = fVar156 * fVar79;
                      auVar96._8_4_ = fVar157 * fVar110;
                      auVar96._12_4_ = fVar158 * fVar177;
                      auVar100 = vsubps_avx(auVar96,auVar84);
                      in_ZMM10 = ZEXT1664(auVar100);
                      auVar52 = vsubps_avx(_local_1988,*(undefined1 (*) [16])ray);
                      auVar92 = vsubps_avx(auVar10,*(undefined1 (*) [16])(ray + 0x10));
                      auVar116 = vsubps_avx(auVar9,*(undefined1 (*) [16])(ray + 0x20));
                      fVar180 = *(float *)(ray + 0x50);
                      fVar182 = *(float *)(ray + 0x54);
                      fVar183 = *(float *)(ray + 0x58);
                      fVar184 = *(float *)(ray + 0x5c);
                      fVar185 = *(float *)(ray + 0x60);
                      fVar190 = *(float *)(ray + 100);
                      fVar192 = *(float *)(ray + 0x68);
                      fVar194 = *(float *)(ray + 0x6c);
                      fVar135 = auVar116._0_4_;
                      auVar181._0_4_ = fVar135 * fVar180;
                      fVar136 = auVar116._4_4_;
                      auVar181._4_4_ = fVar136 * fVar182;
                      fVar137 = auVar116._8_4_;
                      auVar181._8_4_ = fVar137 * fVar183;
                      fVar138 = auVar116._12_4_;
                      auVar181._12_4_ = fVar138 * fVar184;
                      fVar131 = auVar92._0_4_;
                      auVar188._0_4_ = fVar131 * fVar185;
                      fVar132 = auVar92._4_4_;
                      auVar188._4_4_ = fVar132 * fVar190;
                      fVar133 = auVar92._8_4_;
                      auVar188._8_4_ = fVar133 * fVar192;
                      fVar134 = auVar92._12_4_;
                      auVar188._12_4_ = fVar134 * fVar194;
                      auVar92 = vsubps_avx(auVar188,auVar181);
                      fVar112 = *(float *)(ray + 0x40);
                      fVar113 = *(float *)(ray + 0x44);
                      fVar114 = *(float *)(ray + 0x48);
                      fVar115 = *(float *)(ray + 0x4c);
                      fVar127 = auVar52._0_4_;
                      auVar189._0_4_ = fVar127 * fVar185;
                      fVar128 = auVar52._4_4_;
                      auVar189._4_4_ = fVar128 * fVar190;
                      fVar129 = auVar52._8_4_;
                      auVar189._8_4_ = fVar129 * fVar192;
                      fVar130 = auVar52._12_4_;
                      auVar189._12_4_ = fVar130 * fVar194;
                      auVar200._0_4_ = fVar135 * fVar112;
                      auVar200._4_4_ = fVar136 * fVar113;
                      auVar200._8_4_ = fVar137 * fVar114;
                      auVar200._12_4_ = fVar138 * fVar115;
                      auVar116 = vsubps_avx(auVar200,auVar189);
                      auVar201._0_4_ = fVar131 * fVar112;
                      auVar201._4_4_ = fVar132 * fVar113;
                      auVar201._8_4_ = fVar133 * fVar114;
                      auVar201._12_4_ = fVar134 * fVar115;
                      auVar85._0_4_ = fVar180 * fVar127;
                      auVar85._4_4_ = fVar182 * fVar128;
                      auVar85._8_4_ = fVar183 * fVar129;
                      auVar85._12_4_ = fVar184 * fVar130;
                      auVar117 = vsubps_avx(auVar85,auVar201);
                      in_ZMM14 = ZEXT1664(auVar117);
                      auVar167._0_4_ =
                           auVar101._0_4_ * fVar112 +
                           fVar180 * auVar56._0_4_ + auVar100._0_4_ * fVar185;
                      auVar167._4_4_ =
                           auVar101._4_4_ * fVar113 +
                           fVar182 * auVar56._4_4_ + auVar100._4_4_ * fVar190;
                      auVar167._8_4_ =
                           auVar101._8_4_ * fVar114 +
                           fVar183 * auVar56._8_4_ + auVar100._8_4_ * fVar192;
                      auVar167._12_4_ =
                           auVar101._12_4_ * fVar115 +
                           fVar184 * auVar56._12_4_ + auVar100._12_4_ * fVar194;
                      auVar168 = ZEXT1664(auVar167);
                      auVar65._8_4_ = 0x80000000;
                      auVar65._0_8_ = 0x8000000080000000;
                      auVar65._12_4_ = 0x80000000;
                      auVar52 = vandps_avx(auVar167,auVar65);
                      auVar66._0_4_ = auVar92._0_4_ * fVar55;
                      auVar66._4_4_ = auVar92._4_4_ * fVar79;
                      auVar66._8_4_ = auVar92._8_4_ * fVar110;
                      auVar66._12_4_ = auVar92._12_4_ * fVar177;
                      uVar171 = auVar52._0_4_;
                      auVar107._0_4_ =
                           (float)(uVar171 ^
                                  (uint)(auVar66._0_4_ +
                                        fVar139 * auVar116._0_4_ + fVar53 * auVar117._0_4_));
                      uVar174 = auVar52._4_4_;
                      auVar107._4_4_ =
                           (float)(uVar174 ^
                                  (uint)(auVar66._4_4_ +
                                        fVar146 * auVar116._4_4_ + fVar38 * auVar117._4_4_));
                      uVar176 = auVar52._8_4_;
                      auVar107._8_4_ =
                           (float)(uVar176 ^
                                  (uint)(auVar66._8_4_ +
                                        fVar147 * auVar116._8_4_ + fVar99 * auVar117._8_4_));
                      uVar178 = auVar52._12_4_;
                      auVar107._12_4_ =
                           (float)(uVar178 ^
                                  (uint)(auVar66._12_4_ +
                                        fVar148 * auVar116._12_4_ + fVar172 * auVar117._12_4_));
                      auVar90 = ZEXT1664(auVar43);
                      auVar52 = vcmpps_avx(auVar107,_DAT_01f7aa10,5);
                      auVar140 = auVar43 & auVar52;
                      if ((((auVar140 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                           (auVar140 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar140 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          -1 < auVar140[0xf]) {
                        auVar52 = vpcmpeqd_avx(auVar66,auVar66);
                        auVar77 = ZEXT1664(auVar52);
                      }
                      else {
                        auVar52 = vandps_avx(auVar52,auVar43);
                        auVar69._0_4_ = auVar92._0_4_ * fVar91;
                        auVar69._4_4_ = auVar92._4_4_ * fVar80;
                        auVar69._8_4_ = auVar92._8_4_ * fVar111;
                        auVar69._12_4_ = auVar92._12_4_ * fVar179;
                        auVar125._0_4_ =
                             (float)(uVar171 ^
                                    (uint)(auVar69._0_4_ +
                                          auVar116._0_4_ * fVar149 + auVar117._0_4_ * fVar54));
                        auVar125._4_4_ =
                             (float)(uVar174 ^
                                    (uint)(auVar69._4_4_ +
                                          auVar116._4_4_ * fVar156 + auVar117._4_4_ * fVar78));
                        auVar125._8_4_ =
                             (float)(uVar176 ^
                                    (uint)(auVar69._8_4_ +
                                          auVar116._8_4_ * fVar157 + auVar117._8_4_ * fVar109));
                        auVar125._12_4_ =
                             (float)(uVar178 ^
                                    (uint)(auVar69._12_4_ +
                                          auVar116._12_4_ * fVar158 + auVar117._12_4_ * fVar175));
                        auVar92 = vcmpps_avx(auVar125,_DAT_01f7aa10,5);
                        auVar116 = auVar52 & auVar92;
                        if ((((auVar116 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                             (auVar116 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                            (auVar116 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                            -1 < auVar116[0xf]) {
                          auVar140 = vpcmpeqd_avx(auVar69,auVar69);
                        }
                        else {
                          auVar47._8_4_ = 0x7fffffff;
                          auVar47._0_8_ = 0x7fffffff7fffffff;
                          auVar47._12_4_ = 0x7fffffff;
                          auVar116 = vandps_avx(auVar167,auVar47);
                          auVar92 = vandps_avx(auVar92,auVar52);
                          auVar52 = vsubps_avx(auVar116,auVar107);
                          auVar52 = vcmpps_avx(auVar52,auVar125,5);
                          auVar141 = auVar92 & auVar52;
                          auVar140 = vpcmpeqd_avx(auVar69,auVar69);
                          if ((((auVar141 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0
                               || (auVar141 >> 0x3f & (undefined1  [16])0x1) !=
                                  (undefined1  [16])0x0) ||
                              (auVar141 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                              || auVar141[0xf] < '\0') {
                            auVar52 = vandps_avx(auVar52,auVar92);
                            in_ZMM10 = ZEXT1664(auVar52);
                            auVar173._0_4_ =
                                 (float)(uVar171 ^
                                        (uint)(auVar101._0_4_ * fVar127 +
                                              fVar131 * auVar56._0_4_ + fVar135 * auVar100._0_4_));
                            auVar173._4_4_ =
                                 (float)(uVar174 ^
                                        (uint)(auVar101._4_4_ * fVar128 +
                                              fVar132 * auVar56._4_4_ + fVar136 * auVar100._4_4_));
                            auVar173._8_4_ =
                                 (float)(uVar176 ^
                                        (uint)(auVar101._8_4_ * fVar129 +
                                              fVar133 * auVar56._8_4_ + fVar137 * auVar100._8_4_));
                            auVar173._12_4_ =
                                 (float)(uVar178 ^
                                        (uint)(auVar101._12_4_ * fVar130 +
                                              fVar134 * auVar56._12_4_ + fVar138 * auVar100._12_4_))
                            ;
                            fVar53 = auVar116._0_4_;
                            auVar48._0_4_ = fVar53 * *(float *)(ray + 0x30);
                            fVar54 = auVar116._4_4_;
                            auVar48._4_4_ = fVar54 * *(float *)(ray + 0x34);
                            fVar55 = auVar116._8_4_;
                            auVar48._8_4_ = fVar55 * *(float *)(ray + 0x38);
                            fVar91 = auVar116._12_4_;
                            auVar48._12_4_ = fVar91 * *(float *)(ray + 0x3c);
                            auVar92 = vcmpps_avx(auVar48,auVar173,1);
                            _local_1a18 = *(__m128 *)(ray + 0x80);
                            auVar71._0_4_ = fVar53 * *(float *)(ray + 0x80);
                            auVar71._4_4_ = fVar54 * *(float *)(ray + 0x84);
                            auVar71._8_4_ = fVar55 * *(float *)(ray + 0x88);
                            auVar71._12_4_ = fVar91 * *(float *)(ray + 0x8c);
                            aVar187 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                                      vcmpps_avx(auVar173,auVar71,2);
                            auVar92 = vandps_avx((undefined1  [16])aVar187,auVar92);
                            auVar140 = auVar52 & auVar92;
                            if ((((auVar140 >> 0x1f & (undefined1  [16])0x1) ==
                                  (undefined1  [16])0x0 &&
                                 (auVar140 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0
                                 ) && (auVar140 >> 0x5f & (undefined1  [16])0x1) ==
                                      (undefined1  [16])0x0) && -1 < auVar140[0xf]) {
LAB_002ff469:
                              auVar52 = vpcmpeqd_avx((undefined1  [16])aVar187,
                                                     (undefined1  [16])aVar187);
                            }
                            else {
                              auVar92 = vandps_avx(auVar52,auVar92);
                              auVar140 = vcmpps_avx(auVar167,_DAT_01f7aa10,4);
                              auVar141 = auVar92 & auVar140;
                              if ((((auVar141 >> 0x1f & (undefined1  [16])0x1) ==
                                    (undefined1  [16])0x0 &&
                                   (auVar141 >> 0x3f & (undefined1  [16])0x1) ==
                                   (undefined1  [16])0x0) &&
                                  (auVar141 >> 0x5f & (undefined1  [16])0x1) ==
                                  (undefined1  [16])0x0) && -1 < auVar141[0xf]) goto LAB_002ff469;
                              auVar92 = vandps_avx(auVar140,auVar92);
                              uVar174 = *(uint *)(lVar26 + 0x40 + uVar28 * 4);
                              pGVar3 = (context->scene->geometries).items[uVar174].ptr;
                              uVar171 = pGVar3->mask;
                              auVar49._4_4_ = uVar171;
                              auVar49._0_4_ = uVar171;
                              auVar49._8_4_ = uVar171;
                              auVar49._12_4_ = uVar171;
                              auVar140 = vandps_avx(auVar49,*(undefined1 (*) [16])(ray + 0x90));
                              auVar140 = vpcmpeqd_avx(auVar140,_DAT_01f7aa10);
                              auVar141 = auVar92 & ~auVar140;
                              if ((((auVar141 >> 0x1f & (undefined1  [16])0x1) ==
                                    (undefined1  [16])0x0 &&
                                   (auVar141 >> 0x3f & (undefined1  [16])0x1) ==
                                   (undefined1  [16])0x0) &&
                                  (auVar141 >> 0x5f & (undefined1  [16])0x1) ==
                                  (undefined1  [16])0x0) && -1 < auVar141[0xf]) goto LAB_002ff469;
                              aVar98 = (anon_union_16_2_9473010e_for_vint_impl<4>_1)
                                       vandnps_avx(auVar140,auVar92);
                              if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                                 (pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                                auVar92 = vrcpps_avx(auVar116);
                                fVar38 = auVar92._0_4_;
                                auVar74._0_4_ = fVar53 * fVar38;
                                fVar53 = auVar92._4_4_;
                                auVar74._4_4_ = fVar54 * fVar53;
                                fVar54 = auVar92._8_4_;
                                auVar74._8_4_ = fVar55 * fVar54;
                                fVar55 = auVar92._12_4_;
                                auVar74._12_4_ = fVar91 * fVar55;
                                auVar155._8_4_ = 0x3f800000;
                                auVar155._0_8_ = 0x3f8000003f800000;
                                auVar155._12_4_ = 0x3f800000;
                                auVar92 = vsubps_avx(auVar155,auVar74);
                                fVar38 = fVar38 + fVar38 * auVar92._0_4_;
                                fVar53 = fVar53 + fVar53 * auVar92._4_4_;
                                fVar54 = fVar54 + fVar54 * auVar92._8_4_;
                                fVar55 = fVar55 + fVar55 * auVar92._12_4_;
                                auVar75._0_4_ = fVar38 * auVar107._0_4_;
                                auVar75._4_4_ = fVar53 * auVar107._4_4_;
                                auVar75._8_4_ = fVar54 * auVar107._8_4_;
                                auVar75._12_4_ = fVar55 * auVar107._12_4_;
                                auVar92 = vminps_avx(auVar75,auVar155);
                                auVar87._0_4_ = fVar38 * auVar125._0_4_;
                                auVar87._4_4_ = fVar53 * auVar125._4_4_;
                                auVar87._8_4_ = fVar54 * auVar125._8_4_;
                                auVar87._12_4_ = fVar55 * auVar125._12_4_;
                                auVar116 = vminps_avx(auVar87,auVar155);
                                auVar140 = vsubps_avx(auVar155,auVar92);
                                auVar141 = vsubps_avx(auVar155,auVar116);
                                auVar14._8_8_ = uVar19;
                                auVar14._0_8_ = uVar18;
                                auVar92 = vblendvps_avx(auVar92,auVar140,auVar14);
                                vblendvps_avx(auVar116,auVar141,auVar14);
                                vpshufd_avx(ZEXT416(uVar174),0);
                                vpshufd_avx(ZEXT416(*(uint *)(lVar26 + 0x50 + uVar28 * 4)),0);
                                p0.field_0._0_16_ = auVar101;
                                local_1988 = auVar56._0_8_;
                                uStack_1980 = auVar56._8_8_;
                                p0.field_0._16_8_ = local_1988;
                                p0.field_0._24_8_ = uStack_1980;
                                p0.field_0._32_16_ = auVar100;
                                auVar51._0_4_ = auVar173._0_4_ * fVar38;
                                auVar51._4_4_ = auVar173._4_4_ * fVar53;
                                auVar51._8_4_ = auVar173._8_4_ * fVar54;
                                auVar51._12_4_ = auVar173._12_4_ * fVar55;
                                vcmpps_avx(ZEXT1632(auVar92),ZEXT1632(auVar92),0xf);
                                auVar56 = vblendvps_avx((undefined1  [16])_local_1a18,auVar51,
                                                        (undefined1  [16])aVar98);
                                *(undefined1 (*) [16])(ray + 0x80) = auVar56;
                                itime.field_0 = aVar98;
                                p1.field_0._0_8_ = &itime;
                                p1.field_0._8_8_ = pGVar3->userPtr;
                                p1.field_0._16_8_ = context->user;
                                p1.field_0._24_8_ = ray;
                                p1.field_0._32_8_ = &p0;
                                p1.field_0._40_4_ = 4;
                                if (pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                                  auVar168 = ZEXT1664(auVar167);
                                  in_ZMM10 = ZEXT1664(auVar52);
                                  in_ZMM14 = ZEXT1664(auVar117);
                                  (*pGVar3->occlusionFilterN)((RTCFilterFunctionNArguments *)&p1);
                                }
                                if (itime.field_0 ==
                                    (anon_union_16_2_9473010e_for_vint_impl<4>_1)0x0) {
                                  auVar52 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
                                  auVar52 = auVar52 ^ _DAT_01f7ae20;
                                }
                                else {
                                  p_Var5 = context->args->filter;
                                  if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                                     (((context->args->flags &
                                       RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                       RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                      (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
                                    auVar168 = ZEXT1664(auVar168._0_16_);
                                    in_ZMM10 = ZEXT1664(in_ZMM10._0_16_);
                                    in_ZMM14 = ZEXT1664(in_ZMM14._0_16_);
                                    (*p_Var5)((RTCFilterFunctionNArguments *)&p1);
                                  }
                                  auVar56 = vpcmpeqd_avx((undefined1  [16])itime.field_0,
                                                         _DAT_01f7aa10);
                                  auVar52 = auVar56 ^ _DAT_01f7ae20;
                                  auVar88._8_4_ = 0xff800000;
                                  auVar88._0_8_ = 0xff800000ff800000;
                                  auVar88._12_4_ = 0xff800000;
                                  auVar56 = vblendvps_avx(auVar88,*(undefined1 (*) [16])
                                                                   (p1.field_0._24_8_ + 0x80),
                                                          auVar56);
                                  *(undefined1 (*) [16])(p1.field_0._24_8_ + 0x80) = auVar56;
                                }
                                auVar52 = vpslld_avx(auVar52,0x1f);
                                aVar98 = (anon_union_16_2_9473010e_for_vint_impl<4>_1)
                                         vpsrad_avx(auVar52,0x1f);
                                auVar52 = vblendvps_avx((undefined1  [16])_local_1a18,
                                                        *(undefined1 (*) [16])pRVar1,auVar52);
                                *(undefined1 (*) [16])pRVar1 = auVar52;
                                aVar187.v = _local_1a18;
                              }
                              auVar43 = vpandn_avx((undefined1  [16])aVar98,auVar43);
                              auVar52 = vpcmpeqd_avx((undefined1  [16])aVar187,
                                                     (undefined1  [16])aVar187);
                            }
                            auVar77 = ZEXT1664(auVar52);
                            auVar90 = ZEXT1664(auVar43);
                            goto LAB_002fed0c;
                          }
                        }
                        in_ZMM10 = ZEXT1664(auVar92);
                        auVar77 = ZEXT1664(auVar140);
                        auVar90 = ZEXT1664(auVar43);
                      }
LAB_002fed0c:
                      auVar43 = auVar90._0_16_;
                      if (((((auVar43 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                            (auVar43 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                           (auVar43 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                           -1 < auVar90[0xf]) || (bVar37 = 2 < uVar28, uVar28 = uVar28 + 1, bVar37))
                      break;
                    }
                    auVar52 = auVar77._0_16_;
                    auVar56 = vandps_avx(auVar43,auVar81);
                    auVar81 = auVar81 & auVar43;
                  } while (((((auVar81 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                             (auVar81 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                            (auVar81 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                            auVar81[0xf] < '\0') &&
                          (uVar25 = uVar25 + 1, auVar81 = auVar56, uVar25 < uVar24 - 8));
                  terminated.field_0.i[0] = auVar56._0_4_ ^ auVar77._0_4_;
                  terminated.field_0.i[1] = auVar56._4_4_ ^ auVar77._4_4_;
                  terminated.field_0.i[2] = auVar56._8_4_ ^ auVar77._8_4_;
                  terminated.field_0.i[3] = auVar56._12_4_ ^ auVar77._12_4_;
                }
                terminated.field_0 =
                     (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)
                     vpor_avx((undefined1  [16])vVar20.field_0,(undefined1  [16])terminated.field_0)
                ;
                auVar52 = auVar52 & ~(undefined1  [16])terminated.field_0;
                if ((((auVar52 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                     (auVar52 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar52 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    -1 < auVar52[0xf]) goto LAB_002ff9d2;
                auVar89._8_4_ = 0xff800000;
                auVar89._0_8_ = 0xff800000ff800000;
                auVar89._12_4_ = 0xff800000;
                aVar187.v = (__m128)vblendvps_avx(tray.tfar.field_0,auVar89,
                                                  (undefined1  [16])terminated.field_0);
                auVar52 = vpcmpeqd_avx((undefined1  [16])tray.tfar.field_0,
                                       (undefined1  [16])tray.tfar.field_0);
                auVar77 = ZEXT1664(auVar52);
                tray.tfar.field_0 = aVar187;
              }
              goto LAB_002fe4ff;
            }
            uVar24 = root.ptr & 0xfffffffffffffff0;
            auVar52 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,auVar90._0_16_,6);
            auVar57._8_4_ = 0x7f800000;
            auVar57._0_8_ = 0x7f8000007f800000;
            auVar57._12_4_ = 0x7f800000;
            lVar26 = -0x10;
            root.ptr = 8;
            do {
              sVar2 = *(size_t *)(uVar24 + 0x20 + lVar26 * 2);
              if (sVar2 == 8) {
                auVar90 = ZEXT1664(auVar57);
                break;
              }
              fVar53 = *(float *)(uVar24 + 0x90 + lVar26);
              fVar54 = *(float *)(uVar24 + 0x30 + lVar26);
              auVar81 = *(undefined1 (*) [16])(ray + 0x70);
              fVar55 = auVar81._0_4_;
              fVar91 = auVar81._4_4_;
              fVar38 = auVar81._8_4_;
              fVar78 = auVar81._12_4_;
              auVar93._0_4_ = fVar55 * fVar53 + fVar54;
              auVar93._4_4_ = fVar91 * fVar53 + fVar54;
              auVar93._8_4_ = fVar38 * fVar53 + fVar54;
              auVar93._12_4_ = fVar78 * fVar53 + fVar54;
              fVar53 = *(float *)(uVar24 + 0xb0 + lVar26);
              fVar54 = *(float *)(uVar24 + 0x50 + lVar26);
              auVar102._0_4_ = fVar55 * fVar53 + fVar54;
              auVar102._4_4_ = fVar91 * fVar53 + fVar54;
              auVar102._8_4_ = fVar38 * fVar53 + fVar54;
              auVar102._12_4_ = fVar78 * fVar53 + fVar54;
              fVar53 = *(float *)(uVar24 + 0xd0 + lVar26);
              fVar54 = *(float *)(uVar24 + 0x70 + lVar26);
              auVar118._0_4_ = fVar55 * fVar53 + fVar54;
              auVar118._4_4_ = fVar91 * fVar53 + fVar54;
              auVar118._8_4_ = fVar38 * fVar53 + fVar54;
              auVar118._12_4_ = fVar78 * fVar53 + fVar54;
              fVar53 = *(float *)(uVar24 + 0xa0 + lVar26);
              fVar54 = *(float *)(uVar24 + 0x40 + lVar26);
              auVar142._0_4_ = fVar55 * fVar53 + fVar54;
              auVar142._4_4_ = fVar91 * fVar53 + fVar54;
              auVar142._8_4_ = fVar38 * fVar53 + fVar54;
              auVar142._12_4_ = fVar78 * fVar53 + fVar54;
              fVar53 = *(float *)(uVar24 + 0xc0 + lVar26);
              fVar54 = *(float *)(uVar24 + 0x60 + lVar26);
              auVar152._0_4_ = fVar54 + fVar55 * fVar53;
              auVar152._4_4_ = fVar54 + fVar91 * fVar53;
              auVar152._8_4_ = fVar54 + fVar38 * fVar53;
              auVar152._12_4_ = fVar54 + fVar78 * fVar53;
              fVar53 = *(float *)(uVar24 + 0xe0 + lVar26);
              fVar54 = *(float *)(uVar24 + 0x80 + lVar26);
              auVar160._0_4_ = fVar53 * fVar55 + fVar54;
              auVar160._4_4_ = fVar53 * fVar91 + fVar54;
              auVar160._8_4_ = fVar53 * fVar38 + fVar54;
              auVar160._12_4_ = fVar53 * fVar78 + fVar54;
              auVar11._8_8_ = tray.org.field_0._8_8_;
              auVar11._0_8_ = tray.org.field_0._0_8_;
              auVar168 = ZEXT1664(auVar11);
              auVar12._8_8_ = tray.org.field_0._24_8_;
              auVar12._0_8_ = tray.org.field_0._16_8_;
              in_ZMM10 = ZEXT1664(auVar12);
              auVar13._8_8_ = tray.org.field_0._40_8_;
              auVar13._0_8_ = tray.org.field_0._32_8_;
              auVar43 = vsubps_avx(auVar93,auVar11);
              auVar186._0_4_ = tray.rdir.field_0._0_4_ * auVar43._0_4_;
              auVar186._4_4_ = tray.rdir.field_0._4_4_ * auVar43._4_4_;
              auVar186._8_4_ = tray.rdir.field_0._8_4_ * auVar43._8_4_;
              auVar186._12_4_ = tray.rdir.field_0._12_4_ * auVar43._12_4_;
              auVar43 = vsubps_avx(auVar102,auVar12);
              auVar195._0_4_ = auVar43._0_4_ * (float)tray.rdir.field_0._16_4_;
              auVar195._4_4_ = auVar43._4_4_ * (float)tray.rdir.field_0._20_4_;
              auVar195._8_4_ = auVar43._8_4_ * (float)tray.rdir.field_0._24_4_;
              auVar195._12_4_ = auVar43._12_4_ * (float)tray.rdir.field_0._28_4_;
              in_ZMM14 = ZEXT1664(auVar195);
              auVar43 = vsubps_avx(auVar118,auVar13);
              auVar202._0_4_ = auVar43._0_4_ * (float)tray.rdir.field_0._32_4_;
              auVar202._4_4_ = auVar43._4_4_ * (float)tray.rdir.field_0._36_4_;
              auVar202._8_4_ = auVar43._8_4_ * (float)tray.rdir.field_0._40_4_;
              auVar202._12_4_ = auVar43._12_4_ * (float)tray.rdir.field_0._44_4_;
              auVar43 = vsubps_avx(auVar142,auVar11);
              auVar143._0_4_ = tray.rdir.field_0._0_4_ * auVar43._0_4_;
              auVar143._4_4_ = tray.rdir.field_0._4_4_ * auVar43._4_4_;
              auVar143._8_4_ = tray.rdir.field_0._8_4_ * auVar43._8_4_;
              auVar143._12_4_ = tray.rdir.field_0._12_4_ * auVar43._12_4_;
              auVar43 = vsubps_avx(auVar152,auVar12);
              auVar103._0_4_ = auVar43._0_4_ * (float)tray.rdir.field_0._16_4_;
              auVar103._4_4_ = auVar43._4_4_ * (float)tray.rdir.field_0._20_4_;
              auVar103._8_4_ = auVar43._8_4_ * (float)tray.rdir.field_0._24_4_;
              auVar103._12_4_ = auVar43._12_4_ * (float)tray.rdir.field_0._28_4_;
              auVar43 = vsubps_avx(auVar160,auVar13);
              auVar119._0_4_ = auVar43._0_4_ * (float)tray.rdir.field_0._32_4_;
              auVar119._4_4_ = auVar43._4_4_ * (float)tray.rdir.field_0._36_4_;
              auVar119._8_4_ = auVar43._8_4_ * (float)tray.rdir.field_0._40_4_;
              auVar119._12_4_ = auVar43._12_4_ * (float)tray.rdir.field_0._44_4_;
              auVar43 = vpminsd_avx(auVar186,auVar143);
              auVar56 = vpminsd_avx(auVar195,auVar103);
              auVar43 = vpmaxsd_avx(auVar43,auVar56);
              auVar56 = vpminsd_avx(auVar202,auVar119);
              auVar43 = vpmaxsd_avx(auVar43,auVar56);
              auVar56 = vpmaxsd_avx(auVar186,auVar143);
              auVar101 = vpmaxsd_avx(auVar195,auVar103);
              auVar100 = vpminsd_avx(auVar56,auVar101);
              auVar56 = vpmaxsd_avx(auVar202,auVar119);
              auVar101 = vpmaxsd_avx(auVar43,(undefined1  [16])tray.tnear.field_0);
              auVar56 = vpminsd_avx(auVar100,auVar56);
              auVar56 = vpminsd_avx(auVar56,(undefined1  [16])tray.tfar.field_0);
              if ((uVar21 & 7) == 6) {
                auVar56 = vcmpps_avx(auVar101,auVar56,2);
                uVar22 = *(undefined4 *)(uVar24 + 0xf0 + lVar26);
                auVar120._4_4_ = uVar22;
                auVar120._0_4_ = uVar22;
                auVar120._8_4_ = uVar22;
                auVar120._12_4_ = uVar22;
                auVar101 = vcmpps_avx(auVar120,auVar81,2);
                uVar22 = *(undefined4 *)(uVar24 + 0x100 + lVar26);
                auVar144._4_4_ = uVar22;
                auVar144._0_4_ = uVar22;
                auVar144._8_4_ = uVar22;
                auVar144._12_4_ = uVar22;
                auVar81 = vcmpps_avx(auVar81,auVar144,1);
                auVar81 = vandps_avx(auVar101,auVar81);
                auVar81 = vandps_avx(auVar81,auVar56);
              }
              else {
                auVar81 = vcmpps_avx(auVar101,auVar56,2);
              }
              auVar81 = vandps_avx(auVar81,auVar52);
              auVar81 = vpslld_avx(auVar81,0x1f);
              if ((((auVar81 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (auVar81 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar81 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  -1 < auVar81[0xf]) {
                auVar90 = ZEXT1664(auVar57);
                sVar2 = root.ptr;
              }
              else {
                auVar104._8_4_ = 0x7f800000;
                auVar104._0_8_ = 0x7f8000007f800000;
                auVar104._12_4_ = 0x7f800000;
                auVar81 = vblendvps_avx(auVar104,auVar43,auVar81);
                auVar90 = ZEXT1664(auVar81);
                if (root.ptr != 8) {
                  pNVar36->ptr = root.ptr;
                  pNVar36 = pNVar36 + 1;
                  *(undefined1 (*) [16])paVar35->v = auVar57;
                  paVar35 = paVar35 + 1;
                }
              }
              root.ptr = sVar2;
              auVar57 = auVar90._0_16_;
              lVar26 = lVar26 + 4;
            } while (lVar26 != 0);
            if (root.ptr == 8) {
              iVar23 = 4;
              auVar52 = vpcmpeqd_avx(auVar57,auVar57);
              auVar77 = ZEXT1664(auVar52);
              goto LAB_002ff908;
            }
            auVar52 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,
                                 (undefined1  [16])auVar90._0_16_,6);
            uVar22 = vmovmskps_avx(auVar52);
            auVar52 = vpcmpeqd_avx(auVar57,auVar57);
            auVar77 = ZEXT1664(auVar52);
          } while ((byte)uVar31 < (byte)POPCOUNT(uVar22));
          pNVar36->ptr = root.ptr;
          pNVar36 = pNVar36 + 1;
          *paVar35 = auVar90._0_16_;
          paVar35 = paVar35 + 1;
          iVar23 = 4;
        }
        else {
          do {
            sVar2 = 0;
            if (uVar24 != 0) {
              for (; (uVar24 >> sVar2 & 1) == 0; sVar2 = sVar2 + 1) {
              }
            }
            auVar77 = ZEXT1664(auVar77._0_16_);
            auVar168 = ZEXT1664(auVar168._0_16_);
            in_ZMM10 = ZEXT1664(in_ZMM10._0_16_);
            in_ZMM14 = ZEXT1664(in_ZMM14._0_16_);
            bVar37 = occluded1(This,bvh,root,sVar2,&pre,ray,&tray,context);
            if (bVar37) {
              terminated.field_0.i[sVar2] = -1;
            }
            uVar24 = uVar24 & uVar24 - 1;
          } while (uVar24 != 0);
          auVar52 = vpcmpeqd_avx(auVar77._0_16_,auVar77._0_16_);
          auVar81 = auVar52 & ~(undefined1  [16])terminated.field_0;
          iVar23 = 3;
          if ((((auVar81 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar81 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar81 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar81[0xf] < '\0') {
            auVar52._8_4_ = 0xff800000;
            auVar52._0_8_ = 0xff800000ff800000;
            auVar52._12_4_ = 0xff800000;
            aVar6.v = (__m128)vblendvps_avx(tray.tfar.field_0,auVar52,
                                            (undefined1  [16])terminated.field_0);
            auVar52 = vpcmpeqd_avx((undefined1  [16])tray.tfar.field_0,
                                   (undefined1  [16])tray.tfar.field_0);
            tray.tfar.field_0 = aVar6;
            iVar23 = 2;
          }
          auVar77 = ZEXT1664(auVar52);
          _local_1a18 = aVar187;
          if (uVar31 < uVar21) goto LAB_002fe53d;
        }
LAB_002ff908:
      } while (iVar23 != 3);
LAB_002ff9d2:
      auVar7 = vandps_avx(auVar7,(undefined1  [16])terminated.field_0);
      auVar76._8_4_ = 0xff800000;
      auVar76._0_8_ = 0xff800000ff800000;
      auVar76._12_4_ = 0xff800000;
      auVar7 = vmaskmovps_avx(auVar7,auVar76);
      *(undefined1 (*) [16])pRVar1 = auVar7;
      return;
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }